

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

int __thiscall QtMWidgets::PageViewPrivate::init(PageViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  PageView *pPVar1;
  int iVar2;
  QWidget *this_00;
  PageControl *this_01;
  QVariantAnimation *this_02;
  QFlags<Qt::WindowType> local_14;
  PageViewPrivate *local_10;
  PageViewPrivate *this_local;
  
  local_10 = this;
  this_00 = (QWidget *)operator_new(0x28);
  pPVar1 = this->q;
  QFlags<Qt::WindowType>::QFlags(&local_14);
  QWidget::QWidget(this_00,(QWidget *)pPVar1,(QFlags_conflict1 *)(ulong)local_14.i);
  this->viewport = this_00;
  this_01 = (PageControl *)operator_new(0x30);
  PageControl::PageControl(this_01,this->viewport);
  this->control = this_01;
  iVar2 = FingerGeometry::height();
  this->controlOffset = iVar2 / 2;
  this_02 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(this_02,(QObject *)this->q);
  this->normalizeAnimation = this_02;
  QVariantAnimation::setDuration((int)this->normalizeAnimation);
  iVar2 = QAbstractAnimation::setLoopCount((int)this->normalizeAnimation);
  return iVar2;
}

Assistant:

void
PageViewPrivate::init()
{
	viewport = new QWidget( q );

	control = new PageControl( viewport );

	controlOffset = FingerGeometry::height() / 2;

	normalizeAnimation = new QVariantAnimation( q );

	normalizeAnimation->setDuration( 300 );

	normalizeAnimation->setLoopCount( 1 );
}